

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_VaryingLengths::_Run(_Test_VaryingLengths *this)

{
  FILE *__stream;
  uint uVar1;
  bool b;
  int iVar2;
  Tester *pTVar3;
  size_t sVar4;
  double dVar5;
  Slice SVar6;
  int local_704;
  Tester local_700;
  double local_560;
  Tester local_558;
  double local_3b8;
  double rate;
  size_t local_3a8;
  Tester local_3a0;
  int local_1fc;
  unsigned_long uStack_1f8;
  int i_1;
  size_t local_1e0;
  Tester local_1d8;
  Slice local_38;
  int local_24;
  uint local_20;
  int i;
  int length;
  int good_filters;
  int mediocre_filters;
  char buffer [4];
  _Test_VaryingLengths *this_local;
  
  length = 0;
  i = 0;
  _mediocre_filters = this;
  for (local_20 = 1; (int)local_20 < 0x2711; local_20 = NextLength(local_20)) {
    BloomTest::Reset(&this->super_BloomTest);
    for (local_24 = 0; local_24 < (int)local_20; local_24 = local_24 + 1) {
      local_38 = Key(local_24,(char *)&good_filters);
      BloomTest::Add(&this->super_BloomTest,&local_38);
    }
    BloomTest::Build(&this->super_BloomTest);
    test::Tester::Tester
              (&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
               ,0x7c);
    local_1e0 = BloomTest::FilterSize(&this->super_BloomTest);
    iVar2 = local_20 * 10;
    if ((int)(local_20 * 10) < 0) {
      iVar2 = local_20 * 10 + 7;
    }
    uStack_1f8 = (unsigned_long)((iVar2 >> 3) + 0x28);
    pTVar3 = test::Tester::IsLe<unsigned_long,unsigned_long>
                       (&local_1d8,&local_1e0,&stack0xfffffffffffffe08);
    test::Tester::operator<<(pTVar3,(int *)&local_20);
    test::Tester::~Tester(&local_1d8);
    for (local_1fc = 0; local_1fc < (int)local_20; local_1fc = local_1fc + 1) {
      test::Tester::Tester
                (&local_3a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
                 ,0x81);
      SVar6 = Key(local_1fc,(char *)&good_filters);
      local_3a8 = SVar6.size_;
      rate = (double)SVar6.data_;
      b = BloomTest::Matches(&this->super_BloomTest,(Slice *)&rate);
      pTVar3 = test::Tester::Is(&local_3a0,b,"Matches(Key(i, buffer))");
      pTVar3 = test::Tester::operator<<(pTVar3,(char (*) [8])"Length ");
      pTVar3 = test::Tester::operator<<(pTVar3,(int *)&local_20);
      pTVar3 = test::Tester::operator<<(pTVar3,(char (*) [7])"; key ");
      test::Tester::operator<<(pTVar3,&local_1fc);
      test::Tester::~Tester(&local_3a0);
    }
    local_3b8 = BloomTest::FalsePositiveRate(&this->super_BloomTest);
    uVar1 = local_20;
    __stream = _stderr;
    dVar5 = local_3b8 * 100.0;
    sVar4 = BloomTest::FilterSize(&this->super_BloomTest);
    fprintf(__stream,"False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",dVar5,(ulong)uVar1,
            sVar4 & 0xffffffff);
    test::Tester::Tester
              (&local_558,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
               ,0x8b);
    local_560 = 0.02;
    test::Tester::IsLe<double,double>(&local_558,&local_3b8,&local_560);
    test::Tester::~Tester(&local_558);
    if (local_3b8 <= 0.0125) {
      i = i + 1;
    }
    else {
      length = length + 1;
    }
  }
  fprintf(_stderr,"Filters: %d good, %d mediocre\n",(ulong)(uint)i,(ulong)(uint)length);
  test::Tester::Tester
            (&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
             ,0x95);
  local_704 = i / 5;
  test::Tester::IsLe<int,int>(&local_700,&length,&local_704);
  test::Tester::~Tester(&local_700);
  return;
}

Assistant:

TEST(BloomTest, VaryingLengths) {
  char buffer[sizeof(int)];

  // Count number of filters that significantly exceed the false positive rate
  int mediocre_filters = 0;
  int good_filters = 0;

  for (int length = 1; length <= 10000; length = NextLength(length)) {
    Reset();
    for (int i = 0; i < length; i++) {
      Add(Key(i, buffer));
    }
    Build();

    ASSERT_LE(FilterSize(), static_cast<size_t>((length * 10 / 8) + 40))
        << length;

    // All added keys must match
    for (int i = 0; i < length; i++) {
      ASSERT_TRUE(Matches(Key(i, buffer)))
          << "Length " << length << "; key " << i;
    }

    // Check false positive rate
    double rate = FalsePositiveRate();
    if (kVerbose >= 1) {
      fprintf(stderr, "False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",
              rate * 100.0, length, static_cast<int>(FilterSize()));
    }
    ASSERT_LE(rate, 0.02);  // Must not be over 2%
    if (rate > 0.0125)
      mediocre_filters++;  // Allowed, but not too often
    else
      good_filters++;
  }
  if (kVerbose >= 1) {
    fprintf(stderr, "Filters: %d good, %d mediocre\n", good_filters,
            mediocre_filters);
  }
  ASSERT_LE(mediocre_filters, good_filters / 5);
}